

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_half_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::ConvertToHalfPass::ProcessConvert(ConvertToHalfPass *this,Instruction *inst)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  undefined8 in_RAX;
  DefUseManager *pDVar4;
  Instruction *this_00;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  bVar1 = IsFloat(this,inst,0x20);
  if (bVar1) {
    uVar2 = Instruction::result_id(inst);
    bVar1 = IsRelaxed(this,uVar2);
    if (bVar1) {
      uVar2 = Instruction::type_id(inst);
      uVar2 = EquivFloatTypeId(this,uVar2,0x10);
      Instruction::SetResultType(inst,uVar2);
      pDVar4 = Pass::get_def_use_mgr(&this->super_Pass);
      analysis::DefUseManager::AnalyzeInstUse(pDVar4,inst);
      uVar2 = Instruction::result_id(inst);
      uStack_28 = CONCAT44(uVar2,(undefined4)uStack_28);
      std::__detail::
      _Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
      ::insert((_Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                *)&this->converted_ids_,(value_type *)((long)&uStack_28 + 4));
    }
  }
  uVar2 = Instruction::GetSingleWordInOperand(inst,0);
  pDVar4 = Pass::get_def_use_mgr(&this->super_Pass);
  this_00 = analysis::DefUseManager::GetDef(pDVar4,uVar2);
  uVar2 = Instruction::type_id(inst);
  uVar3 = Instruction::type_id(this_00);
  if (uVar2 == uVar3) {
    inst->opcode_ = OpCopyObject;
  }
  return true;
}

Assistant:

bool ConvertToHalfPass::ProcessConvert(Instruction* inst) {
  // If float32 and relaxed, change to float16 convert
  if (IsFloat(inst, 32) && IsRelaxed(inst->result_id())) {
    inst->SetResultType(EquivFloatTypeId(inst->type_id(), 16));
    get_def_use_mgr()->AnalyzeInstUse(inst);
    converted_ids_.insert(inst->result_id());
  }
  // If operand and result types are the same, change FConvert to CopyObject to
  // keep validator happy; simplification and DCE will clean it up
  // One way this can happen is if an FConvert generated during this pass
  // (likely by ProcessPhi) is later encountered here and its operand has been
  // changed to half.
  uint32_t val_id = inst->GetSingleWordInOperand(0);
  Instruction* val_inst = get_def_use_mgr()->GetDef(val_id);
  if (inst->type_id() == val_inst->type_id())
    inst->SetOpcode(spv::Op::OpCopyObject);
  return true;  // modified
}